

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_ResetHealth
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  player_t *ppVar1;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  char *pcVar5;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_003f0138;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003f0128:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003f0138:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1921,
                  "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  pAVar4 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar4 == (AActor *)0x0) goto LAB_003f0095;
    bVar2 = DObject::IsKindOf((DObject *)pAVar4,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003f0138;
    }
  }
  else {
    if (pAVar4 != (AActor *)0x0) goto LAB_003f0128;
LAB_003f0095:
    pAVar4 = (AActor *)0x0;
  }
  if (numparam == 1) {
    param = defaultparam->Array;
    if (param[1].field_0.field_3.Type == '\0') {
LAB_003f00bc:
      pAVar4 = COPY_AAPTR(pAVar4,param[1].field_0.i);
      if (pAVar4 != (AActor *)0x0) {
        ppVar1 = pAVar4->player;
        if ((ppVar1 == (player_t *)0x0) || ((ppVar1->mo->super_AActor).health < 1)) {
          if (0 < pAVar4->health) {
            iVar3 = AActor::SpawnHealth(pAVar4);
            pAVar4->health = iVar3;
          }
        }
        else {
          pAVar4 = AActor::GetDefault(&ppVar1->mo->super_AActor);
          iVar3 = pAVar4->health;
          (ppVar1->mo->super_AActor).health = iVar3;
          ppVar1->health = iVar3;
        }
      }
      return 0;
    }
    pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') goto LAB_003f00bc;
    pcVar5 = "(param[paramnum]).Type == REGT_INT";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1922,
                "int AF_AActor_A_ResetHealth(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ResetHealth)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(ptr);

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (!mobj)
	{
		return 0;
	}

	player_t *player = mobj->player;
	if (player && (player->mo->health > 0))
	{
		player->health = player->mo->health = player->mo->GetDefault()->health; //Copied from the resurrect cheat.
	}
	else if (mobj && (mobj->health > 0))
	{
		mobj->health = mobj->SpawnHealth();
	}
	return 0;
}